

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fonts.h
# Opt level: O0

void __thiscall
dlib::font::compute_size<char,std::char_traits<char>,std::allocator<char>>
          (font *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          unsigned_long *width,unsigned_long *height,size_type first,size_type last)

{
  bool bVar1;
  unsigned_short uVar2;
  long lVar3;
  char *pcVar4;
  unsigned_long *puVar5;
  letter *this_00;
  long lVar6;
  long *in_RCX;
  unsigned_long *in_RDX;
  ulong in_RSI;
  long *in_RDI;
  ulong in_R8;
  ulong in_R9;
  size_type i;
  font *f;
  unsigned_long newlines;
  unsigned_long line_width;
  char in_stack_ffffffffffffff8f;
  font *in_stack_ffffffffffffff90;
  ulong local_50;
  long local_40;
  unsigned_long local_38;
  ulong local_30;
  ulong local_28;
  long *local_20;
  unsigned_long *local_18;
  ulong local_10;
  
  local_38 = 0;
  local_40 = 0;
  *in_RDX = 0;
  *in_RCX = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    if (local_30 == 0xffffffffffffffff) {
      lVar3 = std::__cxx11::string::size();
      local_30 = lVar3 - 1;
    }
    for (local_50 = local_28; local_50 <= local_30; local_50 = local_50 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
      if (*pcVar4 != '\r') {
        pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
        if (*pcVar4 == '\n') {
          local_40 = local_40 + 1;
          puVar5 = std::max<unsigned_long>(local_18,&local_38);
          *local_18 = *puVar5;
          local_38 = 0;
        }
        else {
          std::__cxx11::string::operator[](local_10);
          bVar1 = is_combining_char<char>('\0');
          if (!bVar1) {
            std::__cxx11::string::operator[](local_10);
            this_00 = operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
            uVar2 = letter::width(this_00);
            local_38 = uVar2 + local_38;
          }
        }
      }
    }
    puVar5 = std::max<unsigned_long>(local_18,&local_38);
    *local_18 = *puVar5;
    local_40 = local_40 + 1;
    lVar3 = (**(code **)(*in_RDI + 0x20))();
    *local_20 = local_40 * lVar3;
    lVar3 = (**(code **)(*in_RDI + 0x30))();
    lVar6 = (**(code **)(*in_RDI + 0x38))();
    *local_18 = lVar3 + lVar6 + *local_18;
  }
  return;
}

Assistant:

void compute_size (
            const std::basic_string<T,traits,alloc>& str,
            unsigned long& width,
            unsigned long& height,
            typename std::basic_string<T,traits,alloc>::size_type first = 0,
            typename std::basic_string<T,traits,alloc>::size_type last = (std::basic_string<T,traits,alloc>::npos)
        ) const
        {
            typedef std::basic_string<T,traits,alloc> string;
            DLIB_ASSERT ( (last == string::npos) || (first <= last && last < str.size())  ,
                          "\tvoid font::compute_size()"
                          << "\n\tlast == string::npos: " << ((last == string::npos)?"true":"false") 
                          << "\n\tfirst: " << (unsigned long)first 
                          << "\n\tlast:  " << (unsigned long)last 
                          << "\n\tstr.size():  " << (unsigned long)str.size() );

            unsigned long line_width = 0;
            unsigned long newlines = 0;
            width = 0;
            height = 0;

            if (str.size())
            {
                if (last == string::npos)
                    last = str.size()-1;
                const font& f = *this;

                for (typename string::size_type i = first; i <= last; ++i)
                {
                    // ignore '\r' characters
                    if (str[i] == '\r')
                        continue;

                    if (str[i] == '\n')
                    {
                        ++newlines;
                        width = std::max(width,line_width);
                        line_width = 0;
                    }
                    else
                    {
                        if (is_combining_char(str[i]) == false)
                            line_width += f[str[i]].width();
                    }
                }
                width = std::max(width,line_width);

                height = (newlines+1)*f.height();
                width += f.left_overflow() + f.right_overflow();
            }
        }